

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
nlohmann::
basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
::
parser<nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          *this,iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                adapter,parser_callback_t<basic_json<>_> *cb,bool allow_exceptions,
          bool ignore_comments)

{
  long lVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  _Any_data local_38;
  long local_28;
  undefined8 local_20;
  iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18;
  
  _Var2 = adapter.end._M_current;
  local_18.end = adapter.current._M_current;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  local_20 = *(undefined8 *)(_Var2._M_current + 0x18);
  lVar1 = *(long *)(_Var2._M_current + 0x10);
  if (lVar1 != 0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)_Var2._M_current;
    local_38._8_8_ = *(undefined8 *)(_Var2._M_current + 8);
    _Var2._M_current[0x10] = '\0';
    _Var2._M_current[0x11] = '\0';
    _Var2._M_current[0x12] = '\0';
    _Var2._M_current[0x13] = '\0';
    _Var2._M_current[0x14] = '\0';
    _Var2._M_current[0x15] = '\0';
    _Var2._M_current[0x16] = '\0';
    _Var2._M_current[0x17] = '\0';
    _Var2._M_current[0x18] = '\0';
    _Var2._M_current[0x19] = '\0';
    _Var2._M_current[0x1a] = '\0';
    _Var2._M_current[0x1b] = '\0';
    _Var2._M_current[0x1c] = '\0';
    _Var2._M_current[0x1d] = '\0';
    _Var2._M_current[0x1e] = '\0';
    _Var2._M_current[0x1f] = '\0';
    local_28 = lVar1;
  }
  local_18.current._M_current = (char *)this;
  detail::
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::parser(__return_storage_ptr__,&local_18,(parser_callback_t<nlohmann::basic_json<>_> *)&local_38,
           SUB81(cb,0),allow_exceptions);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static ::nlohmann::detail::parser<basic_json, InputAdapterType> parser(
        InputAdapterType adapter,
        detail::parser_callback_t<basic_json>cb = nullptr,
        const bool allow_exceptions = true,
        const bool ignore_comments = false
                                 )
    {
        return ::nlohmann::detail::parser<basic_json, InputAdapterType>(std::move(adapter),
                std::move(cb), allow_exceptions, ignore_comments);
    }